

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O0

void __thiscall
Corrade::Containers::BasicStringView<char>::BasicStringView
          (BasicStringView<char> *this,char *data,size_t size,StringViewFlags flags)

{
  size_t sVar1;
  bool bVar2;
  UnderlyingType UVar3;
  anon_class_1_0_00000001 local_39;
  EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL> local_38;
  UnderlyingType local_30;
  size_t local_28;
  size_t size_local;
  char *data_local;
  BasicStringView<char> *this_local;
  StringViewFlags flags_local;
  
  this->_data = data;
  local_28 = size;
  size_local = (size_t)data;
  data_local = (char *)this;
  this_local = (BasicStringView<char> *)flags._value;
  if (data == (char *)0x0) {
    EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
              (&local_38,NullTerminated);
    local_30 = (UnderlyingType)
               EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::operator&
                         ((EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL> *)
                          &this_local,local_38);
    bVar2 = Containers::EnumSet::operator_cast_to_bool((EnumSet *)&local_30);
    if (bVar2) {
      BasicStringView::anon_class_1_0_00000001::operator()(&local_39);
    }
  }
  sVar1 = local_28;
  UVar3 = Containers::EnumSet::operator_cast_to_unsigned_long((EnumSet *)&this_local);
  this->_sizePlusFlags = sVar1 | UVar3 & 0xc000000000000000;
  return;
}

Assistant:

constexpr /*implicit*/ BasicStringView(T* data, std::size_t size, StringViewFlags flags = {}) noexcept: _data{data}, _sizePlusFlags{(
            /* This ends up being called from BasicStringView(T*, Flags), so
               basically on every implicit conversion from a C string, thus
               the release build perf aspect wins over safety. Additionally,
               it makes little sense to check the size constraint on 64-bit, if
               64-bit code happens to go over then it's got bigger problems
               than this assert. */
            #ifdef CORRADE_TARGET_32BIT
            CORRADE_CONSTEXPR_DEBUG_ASSERT(size < std::size_t{1} << (sizeof(std::size_t)*8 - 2),
                "Containers::StringView: string expected to be smaller than 2^" << Utility::Debug::nospace << sizeof(std::size_t)*8 - 2 << "bytes, got" << size),
            #endif
            CORRADE_CONSTEXPR_DEBUG_ASSERT(data || !(flags & StringViewFlag::NullTerminated),
                "Containers::StringView: can't use StringViewFlag::NullTerminated with null data"),
            size|(std::size_t(flags) & Implementation::StringViewSizeMask))} {}